

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

BufferSp __thiscall
vkt::SpirVAssembly::getSpecializedBuffer<int>(SpirVAssembly *this,deInt64 number)

{
  Buffer<int> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator_type local_3d;
  value_type_conflict4 local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  this_00 = (Buffer<int> *)operator_new(0x20);
  local_3c = (value_type_conflict4)number;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_38,1,&local_3c,&local_3d);
  Buffer<int>::Buffer(this_00,(vector<int,_std::allocator<int>_> *)&local_38);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp getSpecializedBuffer (deInt64 number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, (T)number)));
}